

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O3

ssize_t cf_socket_recv(Curl_cfilter *cf,Curl_easy *data,char *buf,size_t len,CURLcode *err)

{
  int err_00;
  void *pvVar1;
  curl_trc_feat *pcVar2;
  ulong uVar3;
  int *piVar4;
  char *pcVar5;
  curltime cVar6;
  char buffer [256];
  char local_138 [264];
  
  pvVar1 = cf->ctx;
  *err = CURLE_OK;
  uVar3 = recv(*(int *)((long)pvVar1 + 0x98),buf,len,0);
  if (uVar3 == 0xffffffffffffffff) {
    piVar4 = __errno_location();
    err_00 = *piVar4;
    if ((err_00 == 0xb) || (err_00 == 4)) {
      *err = CURLE_AGAIN;
      goto LAB_00115ff8;
    }
    pcVar5 = Curl_strerror(err_00,local_138,0x100);
    Curl_failf(data,"Recv failure: %s",pcVar5);
    (data->state).os_errno = err_00;
    *err = CURLE_RECV_ERROR;
  }
  else {
LAB_00115ff8:
    if (data == (Curl_easy *)0x0) goto LAB_00116042;
  }
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)) &&
      (0 < cf->cft->log_level)))) {
    Curl_trc_cf_infof(data,cf,"recv(len=%zu) -> %d, err=%d",len,uVar3 & 0xffffffff,(ulong)*err);
  }
LAB_00116042:
  if ((0 < (long)uVar3) && ((*(byte *)((long)pvVar1 + 0x134) & 1) == 0)) {
    cVar6 = Curl_now();
    *(time_t *)((long)pvVar1 + 0x120) = cVar6.tv_sec;
    *(int *)((long)pvVar1 + 0x128) = cVar6.tv_usec;
    *(byte *)((long)pvVar1 + 0x134) = *(byte *)((long)pvVar1 + 0x134) | 1;
  }
  return uVar3;
}

Assistant:

static ssize_t cf_socket_recv(struct Curl_cfilter *cf, struct Curl_easy *data,
                              char *buf, size_t len, CURLcode *err)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  ssize_t nread;

  *err = CURLE_OK;

#ifdef DEBUGBUILD
  /* simulate network blocking/partial reads */
  if(cf->cft != &Curl_cft_udp && ctx->rblock_percent > 0) {
    unsigned char c = 0;
    Curl_rand(data, &c, 1);
    if(c >= ((100-ctx->rblock_percent)*256/100)) {
      CURL_TRC_CF(data, cf, "recv(len=%zu) SIMULATE EWOULDBLOCK", len);
      *err = CURLE_AGAIN;
      return -1;
    }
  }
  if(cf->cft != &Curl_cft_udp && ctx->recv_max && ctx->recv_max < len) {
    size_t orig_len = len;
    len = ctx->recv_max;
    CURL_TRC_CF(data, cf, "recv(len=%zu) SIMULATE max read of %zu bytes",
                orig_len, len);
  }
#endif

  *err = CURLE_OK;
  nread = sread(ctx->sock, buf, len);

  if(-1 == nread) {
    int sockerr = SOCKERRNO;

    if(
#ifdef WSAEWOULDBLOCK
      /* This is how Windows does it */
      (WSAEWOULDBLOCK == sockerr)
#else
      /* errno may be EWOULDBLOCK or on some systems EAGAIN when it returned
         due to its inability to send off data without blocking. We therefore
         treat both error codes the same here */
      (EWOULDBLOCK == sockerr) || (EAGAIN == sockerr) || (EINTR == sockerr)
#endif
      ) {
      /* this is just a case of EWOULDBLOCK */
      *err = CURLE_AGAIN;
    }
    else {
      char buffer[STRERROR_LEN];

      failf(data, "Recv failure: %s",
            Curl_strerror(sockerr, buffer, sizeof(buffer)));
      data->state.os_errno = sockerr;
      *err = CURLE_RECV_ERROR;
    }
  }

  CURL_TRC_CF(data, cf, "recv(len=%zu) -> %d, err=%d", len, (int)nread,
              *err);
  if(nread > 0 && !ctx->got_first_byte) {
    ctx->first_byte_at = Curl_now();
    ctx->got_first_byte = TRUE;
  }
  return nread;
}